

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# background_thread.c
# Opt level: O3

_Bool background_thread_create(tsd_t *tsd,uint arena_ind)

{
  _Bool _Var1;
  int iVar2;
  mutex_prof_data_t *data;
  
  iVar2 = pthread_mutex_trylock((pthread_mutex_t *)((long)&background_thread_lock.field_0 + 0x40));
  if (iVar2 != 0) {
    malloc_mutex_lock_slow(&background_thread_lock);
    background_thread_lock.field_0.field_0.locked.repr = (atomic_b_t)true;
  }
  background_thread_lock.field_0.field_0.prof_data.n_lock_ops =
       background_thread_lock.field_0.field_0.prof_data.n_lock_ops + 1;
  if (&(background_thread_lock.field_0.field_0.prof_data.prev_owner)->tsd != tsd) {
    background_thread_lock.field_0.witness.link.qre_prev =
         (witness_t *)(background_thread_lock.field_0.field_0.prof_data.n_owner_switches + 1);
    background_thread_lock.field_0.field_0.prof_data.prev_owner = (tsdn_t *)tsd;
  }
  _Var1 = background_thread_create_locked(tsd,arena_ind);
  background_thread_lock.field_0.field_0.locked.repr = (atomic_b_t)false;
  pthread_mutex_unlock((pthread_mutex_t *)((long)&background_thread_lock.field_0 + 0x40));
  return _Var1;
}

Assistant:

bool
background_thread_create(tsd_t *tsd, unsigned arena_ind) {
	assert(have_background_thread);

	bool ret;
	malloc_mutex_lock(tsd_tsdn(tsd), &background_thread_lock);
	ret = background_thread_create_locked(tsd, arena_ind);
	malloc_mutex_unlock(tsd_tsdn(tsd), &background_thread_lock);

	return ret;
}